

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalWatcomWMakeGenerator.cxx
# Opt level: O0

bool __thiscall
cmGlobalWatcomWMakeGenerator::SetSystemName
          (cmGlobalWatcomWMakeGenerator *this,string *s,cmMakefile *mf)

{
  cmMakefile *pcVar1;
  bool bVar2;
  string *__lhs;
  string_view local_c8;
  allocator<char> local_b1;
  string local_b0;
  string_view local_90;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  cmMakefile *local_20;
  cmMakefile *mf_local;
  string *s_local;
  cmGlobalWatcomWMakeGenerator *this_local;
  
  local_20 = mf;
  mf_local = (cmMakefile *)s;
  s_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"CMAKE_SYSTEM_PROCESSOR",&local_41);
  __lhs = cmMakefile::GetSafeDefinition(mf,&local_40);
  bVar2 = std::operator==(__lhs,"I86");
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  pcVar1 = local_20;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"CMAKE_GENERATOR_CC",&local_79);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_90,"wcl");
    cmMakefile::AddDefinition(pcVar1,&local_78,local_90);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    pcVar1 = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"CMAKE_GENERATOR_CXX",&local_b1);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_c8,"wcl");
    cmMakefile::AddDefinition(pcVar1,&local_b0,local_c8);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator(&local_b1);
  }
  bVar2 = cmGlobalGenerator::SetSystemName((cmGlobalGenerator *)this,(string *)mf_local,local_20);
  return bVar2;
}

Assistant:

bool cmGlobalWatcomWMakeGenerator::SetSystemName(std::string const& s,
                                                 cmMakefile* mf)
{
  if (mf->GetSafeDefinition("CMAKE_SYSTEM_PROCESSOR") == "I86") {
    mf->AddDefinition("CMAKE_GENERATOR_CC", "wcl");
    mf->AddDefinition("CMAKE_GENERATOR_CXX", "wcl");
  }
  return this->cmGlobalUnixMakefileGenerator3::SetSystemName(s, mf);
}